

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall embree::MirrorMaterial::~MirrorMaterial(MirrorMaterial *this)

{
  ~MirrorMaterial((MirrorMaterial *)0x3279b8);
  SceneGraph::MaterialNode::operator_delete((void *)0x3279c2);
  return;
}

Assistant:

struct PREFIX(MirrorMaterial) MATERIAL_BASE_CLASS
  {
#if !defined(ISPC) && !defined(CPPTUTORIAL)
    MirrorMaterial (const Vec3fa& reflectance)
      : base(MATERIAL_MIRROR), reflectance(reflectance) {}
    virtual Material* material() { return &base; }
#endif

    PREFIX(Material) base;
    Vec3fa reflectance;
  }